

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECCurveTest_GenerateFIPS_Test::TestBody
          (ECCurveTest_GenerateFIPS_Test *this)

{
  int iVar1;
  ParamType_conflict *pPVar2;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  UniquePtr<EC_KEY> key;
  Message local_58;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_ec_key_st_*,_false> local_38;
  string local_30;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  local_38._M_head_impl = (ec_key_st *)EC_KEY_new_by_curve_name(*pPVar2);
  local_48[0] = (internal)(local_38._M_head_impl != (EC_KEY *)0x0);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38._M_head_impl == (EC_KEY *)0x0) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_48,(AssertionResult *)0x607821,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x29d,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
  }
  else {
    iVar1 = EC_KEY_generate_key_fips(local_38._M_head_impl);
    local_48[0] = (internal)(iVar1 != 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_48[0]) goto LAB_002e62b4;
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_48,(AssertionResult *)"EC_KEY_generate_key_fips(key.get())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x29e,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_58.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_58.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_002e62b4:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST_P(ECCurveTest, GenerateFIPS) {
  // Generate an EC_KEY.
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key_fips(key.get()));
}